

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void asm_make_ast(void *_line)

{
  asm_ast_node_generic *__s2;
  int iVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined1 *puVar5;
  asm_ast_param *paVar6;
  bool bVar7;
  asm_ast_param **params_1;
  asm_ast_param **params;
  asm_ast_instruction *instruction;
  asm_ast_node_generic *node_2;
  char *trueOpStart;
  asm_ast_directive *directive;
  asm_ast_node_generic *node_1;
  asm_ast_label *label;
  asm_ast_node_generic *node;
  char *opStart;
  char *line;
  void *_line_local;
  
  opStart = (char *)_line;
  while( true ) {
    bVar7 = true;
    if (*opStart != ' ') {
      bVar7 = *opStart == '\t';
    }
    if (!bVar7) break;
    opStart = opStart + 1;
  }
  if (*opStart != '\0') {
    node = (asm_ast_node_generic *)opStart;
    while( true ) {
      if ((((*opStart < 'A') || (bVar7 = true, 'Z' < *opStart)) &&
          ((*opStart < 'a' || (bVar7 = true, 'z' < *opStart)))) &&
         (((((*opStart < '0' || (bVar7 = true, '9' < *opStart)) && (bVar7 = true, *opStart != '$'))
           && ((bVar7 = true, *opStart != '_' && (bVar7 = true, *opStart != '.')))) &&
          (bVar7 = true, *opStart != '+')))) {
        bVar7 = *opStart == '-';
      }
      line = (char *)_line;
      if (!bVar7) break;
      opStart = opStart + 1;
    }
    while (__s2 = node, *opStart == ':') {
      puVar2 = (undefined4 *)malloc(0x10);
      *puVar2 = 0;
      puVar3 = (undefined8 *)malloc(8);
      *opStart = '\0';
      *puVar3 = node;
      ptr_ll_add(cur_ast.nodes,puVar2);
      node = (asm_ast_node_generic *)(opStart + 1);
      opStart = (char *)node;
      while( true ) {
        if (((*opStart < 'A') || (bVar7 = true, 'Z' < *opStart)) &&
           (((*opStart < 'a' || (bVar7 = true, 'z' < *opStart)) &&
            ((((*opStart < '0' || (bVar7 = true, '9' < *opStart)) && (bVar7 = true, *opStart != '$')
              ) && (((bVar7 = true, *opStart != '_' && (bVar7 = true, *opStart != '.')) &&
                    (bVar7 = true, *opStart != '+')))))))) {
          bVar7 = *opStart == '-';
        }
        if (!bVar7) break;
        opStart = opStart + 1;
      }
    }
    if ((char)node->type == '.') {
      node = (asm_ast_node_generic *)((long)&node->type + 1);
      puVar2 = (undefined4 *)malloc(0x10);
      *puVar2 = 2;
      plVar4 = (long *)malloc(0x10);
      *(long **)(puVar2 + 2) = plVar4;
      *opStart = '\0';
      *plVar4 = (long)node;
      for (; (char)node->type != '\0'; node = (asm_ast_node_generic *)((long)&node->type + 1)) {
        if ('`' < (char)node->type) {
          *(char *)&node->type = (char)node->type + -0x20;
        }
      }
      ptr_ll_add(cur_ast.nodes,puVar2);
    }
    else {
      *opStart = '\0';
      for (; (char)node->type != '\0'; node = (asm_ast_node_generic *)((long)&node->type + 1)) {
        if ('`' < (char)node->type) {
          *(char *)&node->type = (char)node->type + -0x20;
        }
      }
      puVar2 = (undefined4 *)malloc(0x10);
      *puVar2 = 1;
      puVar5 = (undefined1 *)malloc(0x10);
      iVar1 = strcmp("BRK",(char *)__s2);
      if (iVar1 == 0) {
        *puVar5 = 0;
      }
      else {
        iVar1 = strcmp("ORA",(char *)__s2);
        if (iVar1 != 0) {
          iVar1 = strcmp("COP",(char *)__s2);
          if (iVar1 == 0) {
            *puVar5 = 2;
          }
          else {
            iVar1 = strcmp("TSB",(char *)__s2);
            if ((iVar1 != 0) && (iVar1 = strcmp("ASL",(char *)__s2), iVar1 != 0)) {
              iVar1 = strcmp("PHP",(char *)__s2);
              if (iVar1 == 0) {
                *puVar5 = 8;
              }
              else {
                iVar1 = strcmp("PHD",(char *)__s2);
                if (iVar1 == 0) {
                  *puVar5 = 0xb;
                }
                else {
                  iVar1 = strcmp("BPL",(char *)__s2);
                  if (iVar1 == 0) {
                    *puVar5 = 0x10;
                    puVar3 = (undefined8 *)malloc(0x10);
                    paVar6 = asm_parse_rel(&opStart);
                    *puVar3 = paVar6;
                    *(undefined8 **)(puVar5 + 8) = puVar3;
                  }
                  else {
                    iVar1 = strcmp("TRB",(char *)__s2);
                    if (iVar1 != 0) {
                      iVar1 = strcmp("CLC",(char *)__s2);
                      if (iVar1 == 0) {
                        *puVar5 = 0x18;
                      }
                      else {
                        iVar1 = strcmp("INC",(char *)__s2);
                        if (iVar1 != 0) {
                          iVar1 = strcmp("TCS",(char *)__s2);
                          if (iVar1 == 0) {
                            *puVar5 = 0x1b;
                          }
                          else {
                            iVar1 = strcmp("JSR",(char *)__s2);
                            if ((iVar1 != 0) && (iVar1 = strcmp("AND",(char *)__s2), iVar1 != 0)) {
                              iVar1 = strcmp("JSL",(char *)__s2);
                              if (iVar1 == 0) {
                                *puVar5 = 0x22;
                                puVar3 = (undefined8 *)malloc(0x10);
                                paVar6 = asm_parse_long(&opStart);
                                *puVar3 = paVar6;
                                *(undefined8 **)(puVar5 + 8) = puVar3;
                              }
                              else {
                                iVar1 = strcmp("BIT",(char *)__s2);
                                if (iVar1 != 0) {
                                  fprintf(_stderr,"Error: unrecognized instruction \"%s\"!\n",__s2);
                                  exit(1);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void asm_make_ast(void *_line) {
    char *line = (char*)_line;
    while(*line == ' ' || *line == '\t') line++;
    if(*line == 0) return;
    char *opStart = line;
    while(
        (*line >= 'A' && *line <= 'Z') ||
        (*line >= 'a' && *line <= 'z') ||
        (*line >= '0' && *line <= '9') ||
        *line == '$' ||
        *line == '_' ||
        *line == '.' ||
        *line == '+' ||
        *line == '-'
    ) line++;

    while(*line == ':') {
        // Label
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 0;
        struct asm_ast_label *label = malloc(sizeof(struct asm_ast_label));
        *line = 0; // Nice null terminator ;)
        label->label = opStart;
        ptr_ll_add(cur_ast.nodes, node);

        // Right, now we need to reset in case there's a label or another instruction after this. Right.
        line++;
        opStart = line;
        while(
            (*line >= 'A' && *line <= 'Z') ||
            (*line >= 'a' && *line <= 'z') ||
            (*line >= '0' && *line <= '9') ||
            *line == '$' ||
            *line == '_' ||
            *line == '.' ||
            *line == '+' ||
            *line == '-'
        ) line++;
    }
    if(*opStart == '.') {
        opStart++; // Directive
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 2;
        struct asm_ast_directive *directive = malloc(sizeof(struct asm_ast_directive));
        node->node = directive;
        *line = 0; // Null terminate, as always
        directive->directive = opStart;
        while(*opStart != 0) { // And now, to capitalize
            if(*opStart >= 'a') *opStart -= 'a' - 'A';
            opStart++;
        }
        // I know that plenty of directives have parameters.
        // I'm going to ignore that for now, because I don't know what they are.
        ptr_ll_add(cur_ast.nodes, node);
    } else { // Instruction
        *line = 0; // Null terminate. Of course.
        char *trueOpStart = opStart;
        while(*opStart != 0) { // And now, to capitalize. Early.
            if(*opStart >= 'a') *opStart -= 'a' - 'A';
            opStart++;
        }
        opStart = trueOpStart;
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 1;
        struct asm_ast_instruction *instruction = malloc(sizeof(struct asm_ast_instruction));
        if(!strcmp("BRK", opStart)) { // Fun fact, !strcmp means they're equal.
            instruction->opcode = 0;
        } else if(!strcmp("ORA", opStart)) { // Opcodes $01, $03, $05, $07, $09, $0D, $0F, $11, $12, $13, $15, $17, $19, $1D, $1F
            
        } else if(!strcmp("COP", opStart)) {
            instruction->opcode = 2;
        } else if(!strcmp("TSB", opStart)) { // Opcodes $04, $0C
            
        } else if(!strcmp("ASL", opStart)) { // Opcodes $06, $0A, $0E, $16, $1E
            
        } else if(!strcmp("PHP", opStart)) {
            instruction->opcode = 8;
        } else if(!strcmp("PHD", opStart)) {
            instruction->opcode = 0xB;
        } else if(!strcmp("BPL", opStart)) {
            instruction->opcode = 0x10;
            struct asm_ast_param **params = malloc(1*sizeof(struct asm_ast_param)); // 1 operand
            params[0] = asm_parse_rel(&line);
            instruction->params = params;
        } else if(!strcmp("TRB", opStart)) { // Opcodes $14, $1C
            
        } else if(!strcmp("CLC", opStart)) {
            instruction->opcode = 0x18;
        } else if(!strcmp("INC", opStart)) { // Opcodes $1A, $E6, $EE, $F6, $FE
            
        } else if(!strcmp("TCS", opStart)) {
            instruction->opcode = 0x1B;
        } else if(!strcmp("JSR", opStart)) { // Opcodes $20, $FC
            
        } else if(!strcmp("AND", opStart)) { // Opcodes $21, $23, $25, $27, $29, $2D, $2F, $31, $32, $33, $35, $37, $39, $3D, $3F
            
        } else if(!strcmp("JSL", opStart)) {
            instruction->opcode = 0x22;
            struct asm_ast_param **params = malloc(1*sizeof(struct asm_ast_param)); // 1 operand
            params[0] = asm_parse_long(&line);
            instruction->params = params;
        } else if(!strcmp("BIT", opStart)) { // Opcodes $24, $2C, $34, $3C, $89
            
        } else {
            fprintf(stderr, "Error: unrecognized instruction \"%s\"!\n", opStart);
            exit(1);
        }
    }
}